

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcQbf.c
# Opt level: O0

void Abc_NtkVectorPrintVars(Abc_Ntk_t *pNtk,Vec_Int_t *vPiValues,int nPars)

{
  int iVar1;
  uint uVar2;
  int local_20;
  int i;
  int nPars_local;
  Vec_Int_t *vPiValues_local;
  Abc_Ntk_t *pNtk_local;
  
  local_20 = nPars;
  while( true ) {
    iVar1 = Abc_NtkPiNum(pNtk);
    if (iVar1 <= local_20) break;
    uVar2 = Vec_IntEntry(vPiValues,local_20);
    printf("%d",(ulong)uVar2);
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

void Abc_NtkVectorPrintVars( Abc_Ntk_t * pNtk, Vec_Int_t * vPiValues, int nPars )
{
    int i;
    for ( i = nPars; i < Abc_NtkPiNum(pNtk); i++ )
        printf( "%d", Vec_IntEntry(vPiValues,i) );
}